

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FLog.cpp
# Opt level: O2

void FLog::mUserLog(time_t dateTime,string *userName,int line,string *function,string *file,
                   string *text)

{
  id __id;
  char *pcVar1;
  ostream *poVar2;
  time_t dateTime_local;
  string timeTemp;
  string temp;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string threadIdStr;
  string local_288;
  mutex locker;
  ostringstream sstream;
  
  dateTime_local = dateTime;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&sstream);
  __id._M_thread = pthread_self();
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&sstream,__id);
  std::__cxx11::stringbuf::str();
  if (logLevel != none) {
    if (printAll != false || printUser != false) {
      pcVar1 = ctime(&dateTime_local);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&timeTemp,pcVar1,(allocator<char> *)&locker);
      std::__cxx11::string::replace((ulong)&timeTemp,timeTemp._M_string_length - 1,(char *)0x1);
      std::operator+(&local_508," [DateTime: ",&timeTemp);
      std::operator+(&local_4e8,&local_508," ] ");
      std::operator+(&local_4c8,&local_4e8," [Type: User    ] ");
      std::operator+(&local_4a8,&local_4c8," [Line: ");
      std::__cxx11::to_string(&local_528,line);
      std::operator+(&local_488,&local_4a8,&local_528);
      std::operator+(&local_468,&local_488," ] ");
      std::operator+(&local_448,&local_468," [Function: ");
      std::operator+(&local_428,&local_448,function);
      std::operator+(&local_408,&local_428," ] ");
      std::operator+(&local_3e8,&local_408," [Thread Id: ");
      std::operator+(&local_3c8,&local_3e8,&threadIdStr);
      std::operator+(&local_3a8,&local_3c8," ] ");
      std::operator+(&local_388,&local_3a8," [File: ");
      std::operator+(&local_368,&local_388,file);
      std::operator+(&local_348,&local_368," ] ");
      std::operator+(&local_328,&local_348," [User: ");
      std::operator+(&local_308,&local_328,userName);
      std::operator+(&local_2e8,&local_308," ] ");
      std::operator+(&local_2c8,&local_2e8," [MSG: ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&locker,
                     &local_2c8,text);
      std::operator+(&temp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &locker," ] ");
      std::__cxx11::string::~string((string *)&locker);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_508);
      locker.super___mutex_base._M_mutex._16_8_ = 0;
      locker.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
      locker.super___mutex_base._M_mutex.__align = 0;
      locker.super___mutex_base._M_mutex._8_8_ = 0;
      locker.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
      std::mutex::lock(&locker);
      poVar2 = std::operator<<((ostream *)&std::clog,(string *)&temp);
      std::endl<char,std::char_traits<char>>(poVar2);
      pthread_mutex_unlock((pthread_mutex_t *)&locker);
      std::__cxx11::string::~string((string *)&temp);
      std::__cxx11::string::~string((string *)&timeTemp);
    }
    pcVar1 = ctime(&dateTime_local);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_548,pcVar1,(allocator<char> *)&timeTemp);
    std::__cxx11::to_string(&local_568,line);
    std::__cxx11::string::string((string *)&local_588,(string *)file);
    std::__cxx11::string::string((string *)&local_5a8,(string *)text);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c8,"user",(allocator<char> *)&temp);
    std::__cxx11::string::string((string *)&local_288,(string *)userName);
    FONQRI::UserLog::UserLog
              ((UserLog *)&locker,&local_548,&local_568,&local_588,&local_5a8,&local_5c8,&local_288)
    ;
    std::vector<FONQRI::UserLog,_std::allocator<FONQRI::UserLog>_>::emplace_back<FONQRI::UserLog>
              (&userLogList,(UserLog *)&locker);
    FONQRI::UserLog::~UserLog((UserLog *)&locker);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::__cxx11::string::~string((string *)&local_588);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&local_548);
  }
  std::__cxx11::string::~string((string *)&threadIdStr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sstream);
  return;
}

Assistant:

void FLog::mUserLog(std::time_t dateTime, std::string userName, int line,
			std::string function, std::string file, std::string text)
{

	// get thread id and convert it to string
	std::ostringstream sstream;
	sstream << std::this_thread::get_id();
	std::string threadIdStr = sstream.str();

	if (logLevel != FLog::none) {
		if (FLog::printUser | FLog::printAll) {
			std::string timeTemp = std::string(std::ctime(&dateTime));
			timeTemp.replace(timeTemp.size() - 1, 1, "");
			std::string temp =
			" [DateTime: " + timeTemp + " ] " +
			" [Type: User    ] " + " [Line: " +
			std::to_string(line) + " ] " + " [Function: " +
			function + " ] " + " [Thread Id: " + threadIdStr +
			" ] " + " [File: " + file + " ] " + " [User: " +
			userName + " ] " + " [MSG: " + text + " ] ";
			std::mutex locker;
			locker.lock();
			std::clog << temp << std::endl;
			locker.unlock();
		}
		FLog::userLogList.push_back(FONQRI::UserLog(
		std::string(std::ctime(&dateTime)), std::to_string(line), file,
		text, "user", userName));
		if (FLog::userLogList.size() >= FLog::userLogCounts) {
			// NOTE you can save save userLogList  to database
		}
	}
}